

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O2

void Gia_ObjCollectInternal_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  ulong uVar1;
  Vec_Int_t *pVVar2;
  int i;
  int iVar3;
  
  uVar1 = *(ulong *)pObj;
  if ((uVar1 & 0xc0000000) == 0 && (uVar1 & 0x1fffffff) != 0x1fffffff) {
    *(ulong *)pObj = uVar1 | 0x40000000;
    Gia_ObjCollectInternal_rec(p,pObj + -(uVar1 & 0x1fffffff));
    Gia_ObjCollectInternal_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
    pVVar2 = p->vTtNums;
    iVar3 = p->vTtNodes->nSize;
    i = Gia_ObjId(p,pObj);
    Vec_IntWriteEntry(pVVar2,i,iVar3);
    pVVar2 = p->vTtNodes;
    iVar3 = Gia_ObjId(p,pObj);
    Vec_IntPush(pVVar2,iVar3);
    return;
  }
  return;
}

Assistant:

void Gia_ObjCollectInternal_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( !Gia_ObjIsAnd(pObj) )
        return;
    if ( pObj->fMark0 )
        return;
    pObj->fMark0 = 1;
    Gia_ObjCollectInternal_rec( p, Gia_ObjFanin0(pObj) );
    Gia_ObjCollectInternal_rec( p, Gia_ObjFanin1(pObj) );
    Gia_ObjSetNum( p, pObj, Vec_IntSize(p->vTtNodes) );
    Vec_IntPush( p->vTtNodes, Gia_ObjId(p, pObj) );
}